

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cpp
# Opt level: O1

void __thiscall
Lodtalk::AST::PragmaDefinition::appendParameter(PragmaDefinition *this,string *keyword,Node *node)

{
  pointer *pppNVar1;
  iterator __position;
  Node *local_10;
  
  local_10 = node;
  std::__cxx11::string::_M_append((char *)&this->selector,(ulong)(keyword->_M_dataplus)._M_p);
  __position._M_current =
       (this->parameters).
       super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->parameters).
      super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Lodtalk::AST::Node*,std::allocator<Lodtalk::AST::Node*>>::
    _M_realloc_insert<Lodtalk::AST::Node*const&>
              ((vector<Lodtalk::AST::Node*,std::allocator<Lodtalk::AST::Node*>> *)&this->parameters,
               __position,&local_10);
  }
  else {
    *__position._M_current = local_10;
    pppNVar1 = &(this->parameters).
                super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppNVar1 = *pppNVar1 + 1;
  }
  return;
}

Assistant:

void PragmaDefinition::appendParameter(const std::string &keyword, Node *node)
{
    selector += keyword;
    parameters.push_back(node);
}